

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall
HighsMipSolverData::checkSolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution)

{
  int iVar1;
  HighsVarType HVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  double dVar5;
  HighsInt j;
  HighsInt end;
  HighsInt start;
  double rowactivity;
  HighsInt i_1;
  HighsInt i;
  undefined4 in_stack_ffffffffffffff88;
  HighsInt in_stack_ffffffffffffff8c;
  HighsMipSolver *in_stack_ffffffffffffff90;
  int local_34;
  HighsMipSolver *local_28;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (local_1c == **(int **)(*in_RDI + 0x10)) {
      local_20 = 0;
      while( true ) {
        if (local_20 == *(int *)(*(long *)(*in_RDI + 0x10) + 4)) {
          return true;
        }
        local_28 = (HighsMipSolver *)0x0;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc86),(long)local_20);
        local_34 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc86),
                            (long)(local_20 + 1));
        iVar1 = *pvVar4;
        for (; local_34 != iVar1; local_34 = local_34 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc89),(long)local_34);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar4);
          dVar5 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc8c),
                              (long)local_34);
          local_28 = (HighsMipSolver *)(dVar5 * *pvVar3 + (double)local_28);
        }
        dVar5 = HighsMipSolver::rowUpper(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        if (dVar5 + (double)in_RDI[0xcc4] < (double)local_28) break;
        dVar5 = HighsMipSolver::rowLower(local_28,in_stack_ffffffffffffff8c);
        if ((double)local_28 < dVar5 - (double)in_RDI[0xcc4]) {
          return false;
        }
        local_20 = local_20 + 1;
        in_stack_ffffffffffffff90 = local_28;
      }
      return false;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
    dVar5 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(*in_RDI + 0x10) + 0x20),(long)local_1c);
    if (dVar5 < *pvVar3 - (double)in_RDI[0xcc4]) {
      return false;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
    dVar5 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)(*in_RDI + 0x10) + 0x38),(long)local_1c);
    if (*pvVar3 + (double)in_RDI[0xcc4] < dVar5) break;
    HVar2 = HighsMipSolver::variableType(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (HVar2 == kInteger) {
      std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
      dVar5 = fractionality<double>
                        ((double)in_stack_ffffffffffffff90,
                         (double *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if ((double)in_RDI[0xcc4] <= dVar5 && dVar5 != (double)in_RDI[0xcc4]) {
        return false;
      }
    }
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool HighsMipSolverData::checkSolution(
    const std::vector<double>& solution) const {
  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return true;
}